

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::removeHandle
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,btDispatcher *dispatcher
          )

{
  unsigned_short *puVar1;
  ushort uVar2;
  ushort uVar3;
  Handle *pHVar4;
  Edge *pEVar5;
  int iVar6;
  unsigned_short uVar7;
  int iVar8;
  long lVar9;
  undefined6 in_register_00000032;
  long lVar10;
  
  iVar6 = (int)CONCAT62(in_register_00000032,handle);
  lVar10 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
           ((ulong)(uint)(iVar6 * 0x50) - 0x1c);
  iVar8 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((char)iVar8 == '\0') {
    (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[4])
              (this->m_pairCache,lVar10,dispatcher);
  }
  uVar2 = this->m_numHandles;
  pHVar4 = this->m_pHandles;
  lVar9 = 0;
  do {
    puVar1 = pHVar4->m_maxEdges + lVar9;
    *puVar1 = *puVar1 - 2;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  uVar7 = this->m_handleSentinel;
  lVar9 = 0;
  do {
    pEVar5 = this->m_pEdges[lVar9];
    uVar3 = *(ushort *)(lVar10 + 0x42 + lVar9 * 2);
    pEVar5[uVar3].m_pos = uVar7;
    sortMaxUp(this,(int)lVar9,uVar3,dispatcher,false);
    uVar3 = *(ushort *)(lVar10 + 0x3c + lVar9 * 2);
    pEVar5[uVar3].m_pos = this->m_handleSentinel;
    sortMinUp(this,(int)lVar9,uVar3,dispatcher,false);
    pEVar5[(ulong)uVar2 * 2 + -1].m_handle = 0;
    uVar7 = this->m_handleSentinel;
    pEVar5[(ulong)uVar2 * 2 + -1].m_pos = uVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  *(unsigned_short *)
   ((long)(&(this->m_pHandles->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)(uint)(iVar6 * 0x50)
   ) = this->m_firstFreeHandle;
  this->m_firstFreeHandle = handle;
  this->m_numHandles = this->m_numHandles - 1;
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::removeHandle(BP_FP_INT_TYPE handle,btDispatcher* dispatcher)
{

	Handle* pHandle = getHandle(handle);

	//explicitly remove the pairs containing the proxy
	//we could do it also in the sortMinUp (passing true)
	///@todo: compare performance
	if (!m_pairCache->hasDeferredRemoval())
	{
		m_pairCache->removeOverlappingPairsContainingProxy(pHandle,dispatcher);
	}

	// compute current limit of edge arrays
	int limit = static_cast<int>(m_numHandles * 2);
	
	int axis;

	for (axis = 0;axis<3;axis++)
	{
		m_pHandles[0].m_maxEdges[axis] -= 2;
	}

	// remove the edges by sorting them up to the end of the list
	for ( axis = 0; axis < 3; axis++)
	{
		Edge* pEdges = m_pEdges[axis];
		BP_FP_INT_TYPE max = pHandle->m_maxEdges[axis];
		pEdges[max].m_pos = m_handleSentinel;

		sortMaxUp(axis,max,dispatcher,false);


		BP_FP_INT_TYPE i = pHandle->m_minEdges[axis];
		pEdges[i].m_pos = m_handleSentinel;


		sortMinUp(axis,i,dispatcher,false);

		pEdges[limit-1].m_handle = 0;
		pEdges[limit-1].m_pos = m_handleSentinel;
		
#ifdef DEBUG_BROADPHASE
			debugPrintAxis(axis,false);
#endif //DEBUG_BROADPHASE


	}


	// free the handle
	freeHandle(handle);

	
}